

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_to(cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
       basic_item_event_visitor<char> *visitor,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  int value;
  basic_staj_event<char> *pbVar3;
  error_category **this_00;
  error_code *in_RDX;
  cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RSI;
  error_code *in_RDI;
  ser_context *in_stack_00000028;
  basic_item_event_visitor<char> *in_stack_00000030;
  error_code *in_stack_00000498;
  ser_context *in_stack_000004a0;
  basic_item_event_visitor<char> *in_stack_000004a8;
  basic_item_event_receiver<char> *in_stack_000004b0;
  
  bVar1 = is_typed_array((cbor_event_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                          *)0x2fb332);
  if (bVar1) {
    basic_item_event_receiver<char>::dump
              (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*(long *)in_RDI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    bVar1 = is_begin_container(sVar2);
    if (bVar1) {
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::cursor_mode
                ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *
                 )&in_RDI->_M_cat,false);
      this_00 = &in_RDI->_M_cat;
      value = basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
              level((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                     *)0x2fb3af);
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mark_level
                ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *
                 )this_00,value);
      basic_item_event_receiver<char>::dump
                (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498);
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (!bVar1) {
        read_next(in_RSI,(basic_item_event_visitor<char> *)in_RDX,in_RDI);
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
        cursor_mode((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                     *)&in_RDI->_M_cat,true);
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mark_level
                  ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                    *)&in_RDI->_M_cat,0);
        pbVar3 = (basic_staj_event<char> *)(**(code **)(*(long *)in_RDI + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(pbVar3);
        if (sVar2 == begin_object) {
          basic_item_event_visitor<char>::end_object(in_stack_00000030,in_stack_00000028);
        }
        else {
          basic_item_event_visitor<char>::end_array(in_stack_00000030,in_stack_00000028);
        }
      }
    }
    else {
      basic_item_event_receiver<char>::dump
                (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498);
    }
  }
  return;
}

Assistant:

void read_to(basic_item_event_visitor<char_type>& visitor, 
            std::error_code& ec) override
        {
            if (is_typed_array())
            {
                cursor_visitor_.dump(visitor, *this, ec);
            }
            else if (is_begin_container(current().event_type()))
            {
                parser_.cursor_mode(false);
                parser_.mark_level(parser_.level());
                cursor_visitor_.dump(visitor, *this, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                read_next(visitor, ec);
                parser_.cursor_mode(true);
                parser_.mark_level(0);
                if (current().event_type() == staj_event_type::begin_object)
                {
                    cursor_visitor_.end_object(*this);
                }
                else
                {
                    cursor_visitor_.end_array(*this);
                }
            }
            else
            {
                cursor_visitor_.dump(visitor, *this, ec);
            }
        }